

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_yin.c
# Opt level: O0

void yin_print_uses(lyout *out,int level,lys_node *node)

{
  long lVar1;
  lyout *out_00;
  lys_module *plVar2;
  lys_module *plVar3;
  char *pcVar4;
  lys_module *mod;
  lys_node_uses *uses;
  int content;
  int i;
  lys_node *node_local;
  lyout *plStack_10;
  int level_local;
  lyout *out_local;
  
  uses._0_4_ = 0;
  _content = node;
  node_local._4_4_ = level;
  plStack_10 = out;
  ly_print(out,"%*s<uses name=\"",(ulong)(uint)(level << 1),"");
  if (_content->child != (lys_node *)0x0) {
    plVar2 = lys_node_module(_content->child);
    plVar3 = lys_node_module(_content);
    out_00 = plStack_10;
    if (plVar3 != plVar2) {
      pcVar4 = transform_module_name2import_prefix(_content->module,plVar2->name);
      ly_print(out_00,"%s:",pcVar4);
    }
  }
  ly_print(plStack_10,"%s\"",node->name);
  node_local._4_4_ = node_local._4_4_ + 1;
  yin_print_snode_common(plStack_10,node_local._4_4_,_content,_content->module,(int *)&uses,1);
  lVar1._0_1_ = node->hash[0];
  lVar1._1_1_ = node->hash[1];
  lVar1._2_1_ = node->hash[2];
  lVar1._3_1_ = node->hash[3];
  lVar1._4_4_ = *(undefined4 *)&node->field_0x6c;
  if (lVar1 != 0) {
    yin_print_close_parent(plStack_10,(int *)&uses);
    yin_print_when(plStack_10,node_local._4_4_,_content->module,*(lys_when **)node->hash);
  }
  yin_print_snode_common(plStack_10,node_local._4_4_,_content,_content->module,(int *)&uses,0x72);
  for (uses._4_4_ = 0; uses._4_4_ < (int)(uint)node->padding[2]; uses._4_4_ = uses._4_4_ + 1) {
    yin_print_close_parent(plStack_10,(int *)&uses);
    yin_print_refine(plStack_10,node_local._4_4_,_content->module,
                     (lys_refine *)(node[1].name + (long)uses._4_4_ * 0x50));
  }
  for (uses._4_4_ = 0; uses._4_4_ < (int)(uint)node->padding[3]; uses._4_4_ = uses._4_4_ + 1) {
    yin_print_close_parent(plStack_10,(int *)&uses);
    yin_print_augment(plStack_10,node_local._4_4_,_content->module,
                      (lys_node_augment *)(node[1].dsc + (long)uses._4_4_ * 0x68));
  }
  node_local._4_4_ = node_local._4_4_ + -1;
  yin_print_close(plStack_10,node_local._4_4_,(char *)0x0,"uses",(int)uses);
  return;
}

Assistant:

static void
yin_print_uses(struct lyout *out, int level, const struct lys_node *node)
{
    int i, content = 0;
    struct lys_node_uses *uses = (struct lys_node_uses *)node;
    struct lys_module *mod;

    ly_print(out, "%*s<uses name=\"", LEVEL, INDENT);
    if (node->child) {
        mod = lys_node_module(node->child);
        if (lys_node_module(node) != mod) {
            ly_print(out, "%s:", transform_module_name2import_prefix(node->module, mod->name));
        }
    }
    ly_print(out, "%s\"", uses->name);
    level++;

    yin_print_snode_common(out, level, node, node->module, &content, SNODE_COMMON_EXT);
    if (uses->when) {
        yin_print_close_parent(out, &content);
        yin_print_when(out, level, node->module, uses->when);
    }
    yin_print_snode_common(out, level, node, node->module, &content, SNODE_COMMON_IFF |
                           SNODE_COMMON_STATUS | SNODE_COMMON_DSC | SNODE_COMMON_REF);
    for (i = 0; i < uses->refine_size; i++) {
        yin_print_close_parent(out, &content);
        yin_print_refine(out, level, node->module, &uses->refine[i]);
    }
    for (i = 0; i < uses->augment_size; i++) {
        yin_print_close_parent(out, &content);
        yin_print_augment(out, level, node->module, &uses->augment[i]);
    }

    level--;
    yin_print_close(out, level, NULL, "uses", content);
}